

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O2

QDistanceFieldData * QDistanceFieldData::create(QSize size,QPainterPath *path,bool doubleResolution)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  QPoint *pQVar4;
  undefined1 *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  QDistanceFieldData *pQVar12;
  qint32 *bits;
  QPoint *pQVar13;
  long lVar14;
  void *pvVar15;
  QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *pQVar16;
  long lVar17;
  QPoint *pQVar18;
  Representation RVar19;
  int iVar20;
  char *pcVar21;
  int i;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  qreal *pqVar27;
  int *piVar28;
  uint uVar29;
  Representation RVar30;
  int iVar31;
  QTransform *pQVar32;
  qint32 *pqVar33;
  QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *pQVar34;
  int iVar35;
  Representation RVar36;
  int iVar37;
  long lVar38;
  QPoint *pQVar39;
  int iVar40;
  Representation RVar41;
  Representation RVar42;
  int iVar43;
  ulong uVar44;
  int iVar45;
  uint uVar46;
  int *oldD;
  long lVar47;
  uint *puVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  uint width;
  int iVar52;
  int iVar53;
  uint uVar54;
  ulong uVar55;
  long in_FS_OFFSET;
  byte bVar56;
  double dVar57;
  qint32 qVar58;
  undefined8 uVar59;
  int iVar60;
  int *local_3098;
  char *local_3090;
  qint32 local_3080;
  int *local_3078;
  qint32 local_3058;
  int *local_3050;
  int *local_3040;
  char *local_3038;
  char *local_3030;
  uint *local_3028;
  int *local_3020;
  int *local_3018;
  uint *local_3010;
  QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *local_3008;
  uint local_2ffc;
  undefined1 local_2ff8 [8];
  QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *local_2ff0;
  void *local_2fe8;
  ulong local_2fe0;
  char *local_2fd8;
  int local_2fd0;
  int local_2fcc;
  uint *local_2fc8;
  qint32 *local_2fc0;
  uchar *local_2fb8;
  uint *local_2fb0;
  long local_2fa8;
  int local_2fa0;
  int local_2f9c;
  QDistanceFieldData *local_2f98;
  ulong local_2f90;
  qint32 *local_2f88;
  long local_2f80;
  double local_2f78;
  QSize size_local;
  undefined1 local_2f68 [8];
  undefined1 local_2f60 [8];
  QDataBuffer<QPoint> local_2f58;
  QDataBuffer<unsigned_int> local_2f38;
  int local_2f18;
  int local_2f14;
  int local_2f10;
  int local_2f0c;
  int local_2f08;
  int local_2f04;
  QVarLengthArray<bool,_256LL> local_2f00;
  QVarLengthArray<bool,_256LL> local_2de8;
  QVarLengthArray<QPoint,_256LL> local_2cd0;
  QVarLengthArray<QPoint,_256LL> local_24b8;
  QTransform transform;
  QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> scans;
  
  bVar56 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  size_local = size;
  pQVar12 = create(&size_local);
  iVar7 = QT_DISTANCEFIELD_SCALE(doubleResolution);
  iVar8 = QT_DISTANCEFIELD_RADIUS(doubleResolution);
  iVar9 = QT_DISTANCEFIELD_SCALE(doubleResolution);
  iVar8 = iVar8 / iVar9;
  if (pQVar12->data != (uchar *)0x0) {
    local_2fb8 = pQVar12->data;
    bVar6 = QPainterPath::isEmpty(path);
    if (bVar6) {
      memset(local_2fb8,0,(long)pQVar12->nbytes);
    }
    else {
      width = pQVar12->width;
      local_2fe0 = (ulong)pQVar12->height;
      pqVar27 = (qreal *)&DAT_005f4e58;
      pQVar32 = &transform;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        pQVar32->m_matrix[0][0] = *pqVar27;
        pqVar27 = pqVar27 + (ulong)bVar56 * -2 + 1;
        pQVar32 = (QTransform *)((long)pQVar32 + ((ulong)bVar56 * -2 + 1) * 8);
      }
      pqVar27 = (qreal *)&DAT_005f4e10;
      pQVar32 = &transform;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        pQVar32->m_matrix[0][0] = *pqVar27;
        pqVar27 = pqVar27 + (ulong)bVar56 * -2 + 1;
        pQVar32 = (QTransform *)((long)pQVar32 + ((ulong)bVar56 * -2 + 1) * 8);
      }
      transform._72_2_ = 0xa800;
      local_2f98 = pQVar12;
      QTransform::translate(&transform,(double)iVar8,(double)iVar8);
      QTransform::scale(&transform,1.0 / (double)iVar7,1.0 / (double)iVar7);
      local_2f38.capacity = 0;
      local_2f38.siz = 0;
      local_2f38.buffer = (uint *)0x0;
      local_2f58.capacity = 0;
      local_2f58.siz = 0;
      local_2f58.buffer = (QPoint *)0x0;
      qSimplifyPath(path,&local_2f58,&local_2f38,&transform);
      uVar55 = local_2fe0;
      uVar23 = 0;
      if (local_2f58.siz == 0) {
        lcDistanceField();
        if (((byte)lcDistanceField::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a._0_4_ =
               2;
          scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a._4_4_ =
               0;
          scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.s._0_4_ =
               0;
          scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.s._4_4_ =
               0;
          scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.ptr._0_4_
               = 0;
          scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.ptr._4_4_
               = 0;
          scans.super_QVLAStorage<56UL,_8UL,_128LL>.array._0_8_ = lcDistanceField::category.name;
          QMessageLogger::warning();
          QDebug::operator<<((QDebug *)&local_24b8,"Unexpected glyph path structure, bailing out");
          QDebug::~QDebug((QDebug *)&local_24b8);
        }
        pQVar12 = local_2f98;
        memset(local_2fb8,0,(long)local_2f98->nbytes);
      }
      else {
        uVar10 = (int)local_2fe0 * width;
        uVar44 = 0xffffffffffffffff;
        if (-1 < (int)uVar10) {
          uVar44 = (long)(int)uVar10 * 4;
        }
        uVar24 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar24 = uVar23;
        }
        bits = (qint32 *)operator_new__(uVar44);
        local_2fc8 = local_2f38.buffer;
        for (; uVar24 != uVar23; uVar23 = uVar23 + 1) {
          bits[uVar23] = 0x7f80;
        }
        memset(&local_24b8.super_QVLAStorage<8UL,_4UL,_256LL>,0xaa,0x800);
        local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.a = 0x100;
        local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s = 0;
        local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr =
             &local_24b8.super_QVLAStorage<8UL,_4UL,_256LL>;
        memset(&local_2cd0.super_QVLAStorage<8UL,_4UL,_256LL>,0xaa,0x800);
        local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.a = 0x100;
        local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.s = 0;
        local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr =
             &local_2cd0.super_QVLAStorage<8UL,_4UL,_256LL>;
        memset(&local_2de8.super_QVLAStorage<1UL,_1UL,_256LL>,0xaa,0x100);
        local_2de8.super_QVLABase<bool>.super_QVLABaseBase.a = 0x100;
        local_2de8.super_QVLABase<bool>.super_QVLABaseBase.s = 0;
        local_2de8.super_QVLABase<bool>.super_QVLABaseBase.ptr =
             &local_2de8.super_QVLAStorage<1UL,_1UL,_256LL>;
        memset(&local_2f00.super_QVLAStorage<1UL,_1UL,_256LL>,0xaa,0x100);
        pQVar18 = local_2f58.buffer;
        local_2f00.super_QVLABase<bool>.super_QVLABaseBase.a = 0x100;
        local_2f00.super_QVLABase<bool>.super_QVLABaseBase.s = 0;
        iVar9 = (int)local_2f38.siz;
        local_2f00.super_QVLABase<bool>.super_QVLABaseBase.ptr =
             &local_2f00.super_QVLAStorage<1UL,_1UL,_256LL>;
        memset(&scans,0xaa,0x1c18);
        QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL>::QVarLengthArray
                  (&scans,uVar55);
        iVar60 = 0;
        iVar7 = 1;
        while (puVar48 = local_2fc8, uVar55 = local_2fe0, uVar10 = (uint)local_2fe0, iVar7 < iVar9)
        {
          uVar25 = local_2fc8[iVar7];
          iVar22 = iVar7;
          if (uVar25 == 0xffffffff) {
            uVar25 = local_2fc8[iVar60];
            iVar22 = iVar7 + 1;
            iVar60 = iVar22;
          }
          pQVar39 = pQVar18 + local_2fc8[(long)iVar7 + -1];
          pQVar4 = pQVar18 + uVar25;
          pQVar13 = pQVar39;
          if ((pQVar4->yp).m_i < (pQVar39->yp).m_i) {
            pQVar13 = pQVar4;
            pQVar4 = pQVar39;
          }
          iVar7 = (pQVar13->yp).m_i;
          uVar25 = iVar7 >> 8;
          if ((int)uVar25 < 1) {
            uVar25 = 0;
          }
          iVar35 = (pQVar4->yp).m_i;
          uVar29 = iVar35 >> 8;
          if ((int)uVar10 <= (int)uVar29) {
            uVar29 = uVar10;
          }
          if ((int)uVar25 < (int)uVar29) {
            iVar49 = (pQVar13->xp).m_i;
            iVar40 = (pQVar4->xp).m_i - iVar49;
            iVar35 = iVar35 - iVar7;
            iVar49 = (int)(((uVar25 * 0x100 - iVar7) + 0xff) * iVar40) / iVar35 + iVar49;
            lVar17 = (ulong)uVar25 * 0x38;
            lVar47 = (ulong)uVar29 - (ulong)uVar25;
            while (bVar6 = lVar47 != 0, lVar47 = lVar47 + -1, bVar6) {
              if ((uint)(iVar49 >> 8) < width) {
                local_2f60._0_2_ = (short)((uint)iVar49 >> 8);
                QVarLengthArray<unsigned_short,_16LL>::emplace_back<unsigned_short>
                          ((QVarLengthArray<unsigned_short,_16LL> *)
                           (CONCAT44(scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                     super_QVLABaseBase.ptr._4_4_,
                                     scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                     super_QVLABaseBase.ptr._0_4_) + lVar17),
                           (unsigned_short *)local_2f60);
              }
              iVar49 = iVar49 + (iVar40 * 0x100) / iVar35;
              lVar17 = lVar17 + 0x38;
            }
          }
          iVar7 = iVar22 + 1;
        }
        uVar23 = 0;
        local_2f90 = 0;
        if (0 < (int)uVar10) {
          local_2f90 = local_2fe0 & 0xffffffff;
        }
        pqVar33 = bits;
        for (; uVar23 != local_2f90; uVar23 = uVar23 + 1) {
          lVar17 = *(long *)(CONCAT44(scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                      super_QVLABaseBase.ptr._4_4_,
                                      scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                      super_QVLABaseBase.ptr._0_4_) + 0x10 + uVar23 * 0x38);
          iVar7 = (int)*(undefined8 *)
                        (CONCAT44(scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                  super_QVLABaseBase.ptr._4_4_,
                                  scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                  super_QVLABaseBase.ptr._0_4_) + 8 + uVar23 * 0x38);
          for (lVar47 = 1; lVar47 < iVar7; lVar47 = lVar47 + 1) {
            uVar1 = *(ushort *)(lVar17 + lVar47 * 2);
            lVar38 = lVar47;
            while ((lVar38 != 0 && (uVar2 = *(ushort *)(lVar17 + (lVar38 + -1) * 2), uVar1 < uVar2))
                  ) {
              *(ushort *)(lVar17 + lVar38 * 2) = uVar2;
              lVar38 = lVar38 + -1;
            }
            *(ushort *)(lVar17 + lVar38 * 2) = uVar1;
          }
          for (uVar44 = 0; (long)(uVar44 | 1) < (long)iVar7; uVar44 = uVar44 + 2) {
            uVar1 = *(ushort *)(lVar17 + (uVar44 | 1) * 2);
            for (uVar24 = (ulong)*(ushort *)(lVar17 + uVar44 * 2); uVar24 < uVar1;
                uVar24 = uVar24 + 1) {
              pqVar33[uVar24] = -0x7f80;
            }
          }
          if ((int)uVar44 < iVar7) {
            for (uVar44 = (ulong)*(ushort *)(lVar17 + (uVar44 & 0xffffffff) * 2);
                (long)uVar44 < (long)(int)width; uVar44 = uVar44 + 1) {
              pqVar33[uVar44] = -0x7f80;
            }
          }
          pqVar33 = pqVar33 + (int)width;
        }
        QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL>::~QVarLengthArray(&scans);
        local_2f78 = (double)(iVar8 << 0x10);
        local_2fd0 = iVar8 << 8;
        local_2f9c = (width - iVar8) * 0x100;
        local_2fa0 = (uVar10 - iVar8) * 0x100;
        lVar17 = 0;
        while (lVar17 = (long)(int)lVar17, lVar17 < local_2f38.siz) {
          local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s = 0;
          local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.s = 0;
          local_2f00.super_QVLABase<bool>.super_QVLABaseBase.s = 0;
          lVar47 = (lVar17 << 0x20) + -0x100000000;
          local_2f80 = lVar17;
          do {
            lVar38 = local_2f80;
            lVar47 = lVar47 + 0x100000000;
            local_2f80 = lVar38 + 1;
          } while (puVar48[lVar38] != 0xffffffff);
          lVar38 = lVar38 + -1;
          while (lVar14 = lVar17, pQVar18 = local_2f58.buffer, lVar14 < lVar47 >> 0x20) {
            uVar10 = puVar48[lVar14];
            scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a._0_4_
                 = -0x55555556;
            scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a._4_4_
                 = 0xaaaaaaaa;
            iVar7 = local_2f58.buffer[uVar10].xp.m_i;
            iVar8 = local_2f58.buffer[puVar48[(int)lVar38]].xp.m_i;
            iVar9 = local_2f58.buffer[uVar10].yp.m_i -
                    local_2f58.buffer[puVar48[(int)lVar38]].yp.m_i;
            if ((iVar9 != 0) || (iVar8 != iVar7)) {
              iVar8 = iVar8 - iVar7;
              dVar57 = (double)iVar8;
              dVar57 = local_2f78 / SQRT((double)iVar9 * (double)iVar9 + dVar57 * dVar57);
              iVar7 = (int)((double)((ulong)dVar57 & 0x8000000000000000 | (ulong)DAT_005c3780) +
                           dVar57);
              scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a.
              _0_4_ = iVar9 * iVar7 >> 8;
              scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a.
              _4_4_ = iVar8 * iVar7 >> 8;
              QVarLengthArray<QPoint,_256LL>::append(&local_24b8,(QPoint *)&scans);
              local_2f60._0_4_ = pQVar18[uVar10].xp.m_i + 0x7f;
              local_2f60._4_4_ = pQVar18[uVar10].yp.m_i + 0x7f;
              QVarLengthArray<QPoint,_256LL>::append(&local_2cd0,(QPoint *)local_2f60);
              iVar7 = pQVar18[uVar10].xp.m_i;
              bVar6 = true;
              if ((local_2fd0 <= iVar7) &&
                 ((iVar7 < local_2f9c && (iVar7 = pQVar18[uVar10].yp.m_i, local_2fd0 <= iVar7)))) {
                bVar6 = local_2fa0 <= iVar7;
              }
              local_2f68[0] = bVar6;
              QVarLengthArray<bool,_256LL>::emplace_back<bool>(&local_2f00,(bool *)local_2f68);
            }
            lVar38 = lVar14;
            uVar55 = local_2fe0;
            lVar17 = lVar14 + 1;
          }
          uVar59 = 0x411e71;
          QVarLengthArray<bool,_256LL>::resize
                    (&local_2de8,local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s);
          iVar7 = (int)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s + -1;
          lVar17 = 0;
          if (0 < local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s) {
            lVar17 = local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s;
          }
          iVar8 = iVar7;
          for (lVar47 = 0; lVar17 != lVar47; lVar47 = lVar47 + 1) {
            lVar38 = (long)iVar8;
            ((char *)local_2de8.super_QVLABase<bool>.super_QVLABaseBase.ptr)[lVar38] =
                 *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                         lVar47 * 8 + 4) *
                 *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                         lVar38 * 8) <
                 *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                         lVar47 * 8) *
                 *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                         lVar38 * 8 + 4);
            iVar8 = (int)lVar47;
          }
          lVar47 = 0;
          while (lVar17 = local_2f80,
                lVar47 < local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.s) {
            uVar23 = *(ulong *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                               lVar47 * 8);
            uVar24 = uVar23 >> 0x20;
            lVar17 = (long)iVar7;
            pcVar21 = (char *)local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr + lVar17 * 8;
            uVar44 = *(ulong *)pcVar21;
            local_3038 = (char *)local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                         lVar47 * 8;
            uVar10 = *(uint *)(local_3038 + 4);
            local_2fcc = (int)uVar23;
            RVar19.m_i = (int)uVar44 - local_2fcc;
            pvVar15 = (void *)(uVar44 >> 0x20);
            uVar29 = (uint)(uVar44 >> 0x20);
            iVar7 = (int)(uVar23 >> 0x20);
            RVar41.m_i = uVar29 - iVar7;
            local_2f60._4_4_ = RVar41.m_i;
            local_2f60._0_4_ = RVar19.m_i;
            scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a._0_4_
                 = (int)uVar44 + local_2fcc;
            scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a._4_4_
                 = uVar29 + iVar7;
            local_2ff8._0_4_ = *(int *)local_3038 - local_2fcc;
            uVar25 = uVar10 - iVar7;
            local_2ffc = uVar25;
            local_2fcc = *(int *)local_3038 + local_2fcc;
            RVar30.m_i = uVar10 + iVar7;
            local_2ff8._4_4_ = RVar30.m_i;
            local_2fa8 = lVar47;
            qVar58 = (qint32)uVar59;
            if ((((char *)local_2f00.super_QVLABase<bool>.super_QVLABaseBase.ptr)[lVar17] != '\0')
               || (((char *)local_2f00.super_QVLABase<bool>.super_QVLABaseBase.ptr)[lVar47] ==
                   '\x01')) {
              if ((int)uVar10 < (int)uVar29) {
                local_3030._0_4_ = -0x7f80;
                local_2fb0 = (uint *)((long)&scans.
                                             super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                             super_QVLABaseBase.a + 4);
                local_3008 = &scans;
                puVar5 = local_2ff8;
                local_3018 = &local_2fcc;
                local_3028 = &local_2ffc;
                local_2ff0 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)
                             local_2ff8;
                pvVar15 = (void *)(ulong)uVar10;
                uVar46 = uVar25;
                RVar19.m_i = local_2fcc;
                uVar25 = scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                         super_QVLABaseBase.a._4_4_;
                RVar36.m_i = RVar30.m_i;
                RVar30.m_i = RVar41.m_i;
                uVar10 = uVar29;
                local_3090 = local_3038;
                local_3038 = pcVar21;
              }
              else {
                local_2fb0 = &local_2ffc;
                local_3008 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)
                             local_2ff8;
                puVar5 = local_2f60;
                local_3018 = (int *)local_2f60;
                local_3028 = (uint *)((long)&scans.
                                             super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                             super_QVLABaseBase.a + 4);
                local_2ff0 = &scans;
                local_3030._0_4_ = 0x7f80;
                uVar46 = scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                         super_QVLABaseBase.a._4_4_;
                RVar36.m_i = RVar41.m_i;
                local_3090 = pcVar21;
              }
              local_3040 = (int *)(puVar5 + 4);
              local_2fe8 = pvVar15;
              iVar7 = (int)pvVar15 >> 8;
              iVar8 = (int)uVar55;
              if (iVar8 < iVar7) {
                iVar7 = iVar8;
              }
              if (iVar7 < 1) {
                iVar7 = 0;
              }
              iVar9 = (int)uVar10 >> 8;
              if (iVar8 < (int)uVar10 >> 8) {
                iVar9 = iVar8;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              iVar60 = (int)uVar46 >> 8;
              if (iVar8 < (int)uVar46 >> 8) {
                iVar60 = iVar8;
              }
              if (iVar60 < 1) {
                iVar60 = 0;
              }
              local_2fc0 = (qint32 *)CONCAT44(local_2fc0._4_4_,RVar30.m_i);
              iVar22 = RVar30.m_i >> 8;
              if (iVar8 < RVar30.m_i >> 8) {
                iVar22 = iVar8;
              }
              if (iVar22 < 1) {
                iVar22 = 0;
              }
              iVar35 = RVar36.m_i >> 8;
              if (iVar8 < RVar36.m_i >> 8) {
                iVar35 = iVar8;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              local_2fd8 = (char *)CONCAT44(local_2fd8._4_4_,uVar25);
              iVar49 = (int)uVar25 >> 8;
              if (iVar8 < (int)uVar25 >> 8) {
                iVar49 = iVar8;
              }
              local_2f68._0_4_ = local_3030._0_4_;
              local_3078 = (int *)0x0;
              if (iVar49 < 1) {
                iVar49 = 0;
              }
              local_2f88 = (qint32 *)0x0;
              piVar28 = (int *)0x0;
              iVar8 = RVar36.m_i - uVar46;
              if (iVar8 != 0) {
                piVar28 = (int *)((long)((RVar19.m_i -
                                         (int)(local_2ff0->
                                              super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>
                                              ).super_QVLABaseBase.a) * 0x100) / (long)iVar8 &
                                 0xffffffff);
                local_2f88 = (qint32 *)((long)(local_3030._0_4_ << 9) / (long)iVar8 & 0xffffffff);
              }
              iVar40 = (int)(local_3008->super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                            super_QVLABaseBase.a;
              iVar52 = RVar36.m_i - uVar25;
              if (iVar52 != 0) {
                local_3078 = (int *)((long)((RVar19.m_i - iVar40) * 0x100) / (long)iVar52 &
                                    0xffffffff);
              }
              iVar11 = (int)(local_2ff0->super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                            super_QVLABaseBase.a;
              iVar31 = RVar19.m_i - iVar11;
              iVar20 = (iVar11 - iVar40) * iVar8 + (uVar25 - uVar46) * iVar31;
              if (iVar20 == 0) {
                local_3080 = 0;
              }
              else {
                local_3080 = (qint32)(((long)(int)((uVar25 - RVar36.m_i) * local_3030._0_4_) << 9) /
                                     (long)iVar20);
              }
              iVar37 = (iVar7 * 0x100 - (int)pvVar15) + 0xff;
              iVar53 = (iVar9 * 0x100 - uVar10) + 0xff;
              iVar50 = (iVar60 * 0x100 - uVar46) + 0xff;
              iVar45 = (iVar35 * 0x100 - RVar36.m_i) + 0xff;
              local_2f18 = -local_3030._0_4_;
              iVar20 = *(int *)local_3038;
              iVar26 = *(int *)local_3090;
              iVar43 = (int)piVar28;
              if (iVar20 < iVar26) {
                if ((int)uVar46 < (int)uVar25) {
                  local_2f04 = (iVar45 * (RVar19.m_i - iVar40)) / iVar52 + RVar19.m_i;
                  local_2f08 = ((RVar19.m_i - iVar40) * iVar50) / iVar52 + iVar11;
                  if (iVar35 != iVar60) {
                    local_2f10 = iVar26 + (iVar35 - iVar7) * iVar43 + (iVar31 * iVar37) / iVar8;
                    fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                              (bits,width,iVar35,iVar60,(int)&local_2f04,local_3078,(int)&local_2f10
                               ,piVar28,(int)local_2f68,(qint32 *)0x0,local_3080,qVar58);
                  }
                  if (iVar60 != iVar49) {
                    fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                              (bits,width,iVar60,iVar49,(int)&local_2f04,local_3078,(int)&local_2f08
                               ,local_3078,(int)local_2f68,(qint32 *)0x0,local_3080,(qint32)uVar59);
                  }
                  if (iVar49 != iVar22) {
                    local_2f0c = (iVar49 - iVar9) * iVar43 + *(int *)local_3038 +
                                 ((*local_3018 -
                                  (int)(local_2ff0->
                                       super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                       super_QVLABaseBase.a) * iVar53) /
                                 (int)(*local_3040 - *local_3028);
                    iVar7 = (int)&local_2f0c;
LAB_00412859:
                    fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                              (bits,width,iVar49,iVar22,iVar7,piVar28,(int)&local_2f08,local_3078,
                               (int)&local_2f18,(qint32 *)0x0,local_3080,(qint32)uVar59);
                  }
                }
                else {
                  local_2f0c = iVar20 + (iVar49 - iVar9) * iVar43 + (iVar53 * iVar31) / iVar8;
                  local_2f10 = iVar26 + (iVar35 - iVar7) * iVar43 + (iVar37 * iVar31) / iVar8;
                  if (iVar35 != iVar49) {
                    local_2f04 = ((RVar19.m_i - iVar40) * iVar45) / iVar52 + RVar19.m_i;
                    fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                              (bits,width,iVar35,iVar49,(int)&local_2f04,local_3078,(int)&local_2f10
                               ,piVar28,(int)local_2f68,(qint32 *)0x0,local_3080,qVar58);
                  }
                  if (iVar49 != iVar60) {
                    local_2f14 = (int)(((iVar49 << 8 | 0xffU) - *(int *)(local_3038 + 4)) *
                                       local_2f68._0_4_ * 2) / (int)(*local_3040 - *local_3028);
                    fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                              (bits,width,iVar49,iVar60,(int)&local_2f0c,piVar28,(int)&local_2f10,
                               piVar28,(int)&local_2f14,local_2f88,local_3080,(qint32)uVar59);
                  }
                  iVar49 = iVar60;
                  iVar60 = iVar49;
                  if (iVar49 != iVar22) {
                    local_2f08 = ((*local_3018 -
                                  (int)(local_3008->
                                       super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                       super_QVLABaseBase.a) * iVar50) /
                                 (int)(*local_3040 - *local_2fb0) +
                                 (int)(local_2ff0->
                                      super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                      super_QVLABaseBase.a;
                    iVar7 = (int)&local_2f0c;
                    goto LAB_00412859;
                  }
                }
              }
              else if (RVar36.m_i < RVar30.m_i) {
                local_2f04 = (iVar45 * (RVar19.m_i - iVar40)) / iVar52 + RVar19.m_i;
                local_2f08 = ((RVar19.m_i - iVar40) * iVar50) / iVar52 + iVar11;
                if (iVar60 != iVar35) {
                  local_2f0c = iVar26 + (iVar60 - iVar7) * iVar43 + (iVar31 * iVar37) / iVar8;
                  fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                            (bits,width,iVar60,iVar35,(int)&local_2f0c,piVar28,(int)&local_2f08,
                             local_3078,(int)&local_2f18,(qint32 *)0x0,local_3080,qVar58);
                }
                if (iVar35 != iVar22) {
                  fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                            (bits,width,iVar35,iVar22,(int)&local_2f04,local_3078,(int)&local_2f08,
                             local_3078,(int)&local_2f18,(qint32 *)0x0,local_3080,(qint32)uVar59);
                }
                if (iVar22 != iVar49) {
                  local_2f10 = (iVar22 - iVar9) * iVar43 + *(int *)local_3038 +
                               ((*local_3018 -
                                (int)(local_2ff0->
                                     super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                     super_QVLABaseBase.a) * iVar53) /
                               (int)(*local_3040 - *local_3028);
                  iVar7 = (int)&local_2f04;
                  iVar35 = iVar22;
LAB_00412a4c:
                  fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                            (bits,width,iVar35,iVar49,iVar7,local_3078,(int)&local_2f10,piVar28,
                             (int)local_2f68,(qint32 *)0x0,local_3080,(qint32)uVar59);
                }
              }
              else {
                local_2f0c = iVar26 + (iVar60 - iVar7) * iVar43 + (iVar37 * iVar31) / iVar8;
                local_2f10 = iVar20 + (iVar22 - iVar9) * iVar43 + (iVar53 * iVar31) / iVar8;
                if (iVar60 != iVar22) {
                  local_2f08 = ((RVar19.m_i - iVar40) * iVar50) / iVar52 + iVar11;
                  fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                            (bits,width,iVar60,iVar22,(int)&local_2f0c,piVar28,(int)&local_2f08,
                             local_3078,(int)&local_2f18,(qint32 *)0x0,local_3080,qVar58);
                }
                if (iVar22 != iVar35) {
                  local_2f14 = (int)(local_3030._0_4_ *
                                     ((iVar22 << 8 | 0xffU) - *(int *)(local_3038 + 4)) * 2) /
                               (int)(*local_3040 - *local_3028);
                  fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                            (bits,width,iVar22,iVar35,(int)&local_2f0c,piVar28,(int)&local_2f10,
                             piVar28,(int)&local_2f14,local_2f88,local_3080,(qint32)uVar59);
                }
                if (iVar35 != iVar49) {
                  local_2f04 = ((*local_3018 -
                                (int)(local_3008->
                                     super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                     super_QVLABaseBase.a) * iVar45) /
                               (int)(*local_3040 - *local_2fb0) + *local_3018;
                  iVar7 = (int)&local_2f04;
                  goto LAB_00412a4c;
                }
              }
              goto LAB_00413393;
            }
            RVar36.m_i = 0x7f80;
            if ((int)uVar10 < (int)uVar29) {
              RVar36.m_i = -0x7f80;
              local_3010 = &local_2ffc;
              pQVar34 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)local_2ff8;
              local_2fd8 = local_3038;
              puVar5 = local_2ff8;
              local_3020 = &local_2fcc;
              local_2ff0 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)
                           (local_2f60 + 4);
              local_3028 = (uint *)((long)&scans.
                                           super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                           super_QVLABaseBase.a + 4);
              pQVar16 = &scans;
              RVar42.m_i = RVar41.m_i;
              uVar46 = uVar25;
              RVar19.m_i = local_2fcc;
              uVar25 = scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                       super_QVLABaseBase.a._4_4_;
              RVar41.m_i = RVar30.m_i;
              uVar51 = uVar10;
              uVar10 = uVar29;
              local_3030 = pcVar21;
            }
            else {
              local_3010 = (uint *)((long)&scans.
                                           super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                                           super_QVLABaseBase.a + 4);
              pQVar34 = &scans;
              local_2fd8 = pcVar21;
              puVar5 = local_2f60;
              local_3020 = (int *)local_2f60;
              local_2ff0 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)
                           (local_2ff8 + 4);
              local_3028 = &local_2ffc;
              pQVar16 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)local_2ff8;
              RVar42.m_i = RVar30.m_i;
              uVar46 = scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.
                       super_QVLABaseBase.a._4_4_;
              uVar51 = uVar29;
              local_3030 = local_3038;
            }
            local_3050 = (int *)(puVar5 + 4);
            local_2f68._0_4_ = RVar36.m_i;
            local_3098 = (int *)0x0;
            local_2fc0 = (qint32 *)0x0;
            local_3090 = (char *)0x0;
            iVar60 = RVar41.m_i - uVar46;
            if (iVar60 != 0) {
              local_3090 = (char *)((long)((RVar19.m_i -
                                           (int)(pQVar34->
                                                super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>
                                                ).super_QVLABaseBase.a) * 0x100) / (long)iVar60 &
                                   0xffffffff);
              local_2fc0 = (qint32 *)((long)(RVar36.m_i << 9) / (long)iVar60 & 0xffffffff);
            }
            iVar7 = (int)(pQVar16->super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                         super_QVLABaseBase.a;
            iVar8 = RVar41.m_i - uVar25;
            if (iVar8 != 0) {
              local_3098 = (int *)((long)((RVar19.m_i - iVar7) * 0x100) / (long)iVar8 & 0xffffffff);
            }
            iVar9 = (int)(pQVar34->super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                         super_QVLABaseBase.a;
            iVar35 = RVar19.m_i - iVar9;
            iVar22 = (iVar9 - iVar7) * iVar60 + (uVar25 - uVar46) * iVar35;
            if (iVar22 == 0) {
              local_3058 = 0;
            }
            else {
              local_3058 = (qint32)(((long)(int)((uVar25 - RVar41.m_i) * RVar36.m_i) << 9) /
                                   (long)iVar22);
            }
            iVar43 = (int)uVar51 >> 8;
            iVar11 = (int)uVar10 >> 8;
            local_2fe8 = (void *)CONCAT44(local_2fe8._4_4_,iVar11);
            iVar40 = (int)uVar46 >> 8;
            iVar20 = RVar42.m_i >> 8;
            iVar52 = RVar41.m_i >> 8;
            iVar31 = (int)uVar25 >> 8;
            uVar51 = ~uVar51 & 0xff;
            uVar10 = ~uVar10 & 0xff;
            uVar29 = ~uVar46 & 0xff;
            uVar54 = ~RVar41.m_i & 0xff;
            local_2f18 = -RVar36.m_i;
            iVar22 = *(int *)local_3030;
            iVar49 = *(int *)local_2fd8;
            iVar26 = (int)local_3090;
            if (iVar22 < iVar49) {
              if ((int)uVar46 < (int)uVar25) {
                local_2f04 = (int)(uVar54 * (RVar19.m_i - iVar7)) / iVar8 + RVar19.m_i;
                local_2f08 = (int)((RVar19.m_i - iVar7) * uVar29) / iVar8 + iVar9;
                if (iVar52 != iVar40) {
                  local_2f10 = iVar49 + (iVar52 - iVar43) * iVar26 + (int)(iVar35 * uVar51) / iVar60
                  ;
                  fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                            (bits,width,iVar52,iVar40,(int)&local_2f04,local_3098,(int)&local_2f10,
                             (int *)local_3090,(int)local_2f68,(qint32 *)0x0,local_3058,qVar58);
                }
                if (iVar40 != iVar31) {
                  fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                            (bits,width,iVar40,iVar31,(int)&local_2f04,local_3098,(int)&local_2f08,
                             local_3098,(int)local_2f68,(qint32 *)0x0,local_3058,(qint32)uVar59);
                }
                if (iVar31 != iVar20) {
                  local_2f0c = (iVar31 - (int)local_2fe8) * iVar26 + *(int *)local_3030 +
                               (int)((*local_3020 -
                                     (int)(pQVar34->
                                          super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                          super_QVLABaseBase.a) * uVar10) /
                               (int)(*local_3050 - *local_3010);
                  iVar7 = (int)&local_2f0c;
                  iVar40 = iVar31;
LAB_00413183:
                  fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                            (bits,width,iVar40,iVar20,iVar7,(int *)local_3090,(int)&local_2f08,
                             local_3098,(int)&local_2f18,(qint32 *)0x0,local_3058,(qint32)uVar59);
                }
              }
              else {
                local_2f0c = iVar22 + (iVar31 - iVar11) * iVar26 + (int)(uVar10 * iVar35) / iVar60;
                local_2f10 = iVar49 + (iVar52 - iVar43) * iVar26 + (int)(uVar51 * iVar35) / iVar60;
                if (iVar52 != iVar31) {
                  local_2f04 = (int)((RVar19.m_i - iVar7) * uVar54) / iVar8 + RVar19.m_i;
                  fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                            (bits,width,iVar52,iVar31,(int)&local_2f04,local_3098,(int)&local_2f10,
                             (int *)local_3090,(int)local_2f68,(qint32 *)0x0,local_3058,qVar58);
                }
                if (iVar31 != iVar40) {
                  local_2f14 = (int)(((*local_3028 | 0xff) - *(int *)(local_3030 + 4)) *
                                     local_2f68._0_4_ * 2) / (int)(*local_3050 - *local_3010);
                  fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                            (bits,width,iVar31,iVar40,(int)&local_2f0c,(int *)local_3090,
                             (int)&local_2f10,(int *)local_3090,(int)&local_2f14,local_2fc0,
                             local_3058,(qint32)uVar59);
                }
                if (iVar40 != iVar20) {
                  local_2f08 = (int)((*local_3020 -
                                     (int)(pQVar16->
                                          super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                          super_QVLABaseBase.a) * uVar29) /
                               (int)(*local_3050 - *local_3028) +
                               (int)(pQVar34->super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>
                                    ).super_QVLABaseBase.a;
                  iVar7 = (int)&local_2f0c;
                  goto LAB_00413183;
                }
              }
            }
            else if (RVar41.m_i < RVar42.m_i) {
              local_2f04 = (int)(uVar54 * (RVar19.m_i - iVar7)) / iVar8 + RVar19.m_i;
              local_2f08 = (int)((RVar19.m_i - iVar7) * uVar29) / iVar8 + iVar9;
              if (iVar40 != iVar52) {
                local_2f0c = iVar49 + (iVar40 - iVar43) * iVar26 + (int)(iVar35 * uVar51) / iVar60;
                fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                          (bits,width,iVar40,iVar52,(int)&local_2f0c,(int *)local_3090,
                           (int)&local_2f08,local_3098,(int)&local_2f18,(qint32 *)0x0,local_3058,
                           qVar58);
              }
              if (iVar52 != iVar20) {
                fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                          (bits,width,iVar52,iVar20,(int)&local_2f04,local_3098,(int)&local_2f08,
                           local_3098,(int)&local_2f18,(qint32 *)0x0,local_3058,(qint32)uVar59);
              }
              if (iVar20 != iVar31) {
                local_2f10 = (iVar20 - (int)local_2fe8) * iVar26 + *(int *)local_3030 +
                             (int)((*local_3020 -
                                   (int)(pQVar34->
                                        super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                        super_QVLABaseBase.a) * uVar10) /
                             (int)(*local_3050 - *local_3010);
                iVar7 = (int)&local_2f04;
                iVar52 = iVar20;
LAB_00413381:
                fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                          (bits,width,iVar52,iVar31,iVar7,local_3098,(int)&local_2f10,
                           (int *)local_3090,(int)local_2f68,(qint32 *)0x0,local_3058,(qint32)uVar59
                          );
              }
            }
            else {
              local_2f0c = iVar49 + (iVar40 - iVar43) * iVar26 + (int)(uVar51 * iVar35) / iVar60;
              local_2f10 = iVar22 + (iVar20 - iVar11) * iVar26 + (int)(uVar10 * iVar35) / iVar60;
              if (iVar40 != iVar20) {
                local_2f08 = (int)((RVar19.m_i - iVar7) * uVar29) / iVar8 + iVar9;
                fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                          (bits,width,iVar40,iVar20,(int)&local_2f0c,(int *)local_3090,
                           (int)&local_2f08,local_3098,(int)&local_2f18,(qint32 *)0x0,local_3058,
                           qVar58);
              }
              if (iVar20 != iVar52) {
                local_2f14 = (int)(RVar36.m_i *
                                   (((uint)(local_2ff0->
                                           super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                           super_QVLABaseBase.a | 0xff) - *(int *)(local_3030 + 4))
                                  * 2) / (int)(*local_3050 - *local_3010);
                fillLines<((anonymous_namespace)::FillClip)0,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                          (bits,width,iVar20,iVar52,(int)&local_2f0c,(int *)local_3090,
                           (int)&local_2f10,(int *)local_3090,(int)&local_2f14,local_2fc0,local_3058
                           ,(qint32)uVar59);
              }
              if (iVar52 != iVar31) {
                local_2f04 = (int)((*local_3020 -
                                   (int)(pQVar16->
                                        super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>).
                                        super_QVLABaseBase.a) * uVar54) /
                             (int)(*local_3050 - *local_3028) + *local_3020;
                iVar7 = (int)&local_2f04;
                goto LAB_00413381;
              }
            }
LAB_00413393:
            uVar55 = local_2fe0;
            iVar7 = (int)local_2fe0;
            if (((char *)local_2de8.super_QVLABase<bool>.super_QVLABaseBase.ptr)[lVar17] == '\x01')
            {
              if (((char *)local_2f00.super_QVLABase<bool>.super_QVLABaseBase.ptr)[lVar17] != '\0')
              {
                while( true ) {
                  iVar8 = (int)uVar23;
                  uVar10 = (int)uVar24 * -0x1090 + iVar8 * 0x3dd2 >> 0xe;
                  uVar23 = (ulong)uVar10;
                  uVar25 = iVar8 * 0x1090 + (int)uVar24 * 0x3dd2 >> 0xe;
                  uVar24 = (ulong)uVar25;
                  pQVar18 = (QPoint *)
                            ((char *)local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                            lVar17 * 8);
                  iVar8 = (pQVar18->xp).m_i;
                  if ((int)(uVar10 * *(int *)((char *)local_24b8.super_QVLABase<QPoint>.
                                                      super_QVLABaseBase.ptr + lVar17 * 8 + 4)) <=
                      (int)(uVar25 * *(int *)((char *)local_24b8.super_QVLABase<QPoint>.
                                                      super_QVLABaseBase.ptr + lVar17 * 8))) break;
                  local_2f68._4_4_ = (pQVar18->yp).m_i - uVar25;
                  local_2f68._0_4_ = iVar8 - uVar10;
                  drawTriangle<((anonymous_namespace)::FillClip)1>
                            (bits,width,iVar7,pQVar18,(QPoint *)local_2f60,(QPoint *)local_2f68,
                             0x7f80);
                  local_2f60._0_4_ = local_2f68._0_4_;
                  local_2f60._4_4_ = local_2f68._4_4_;
                }
                local_2f68._4_4_ =
                     (pQVar18->yp).m_i -
                     *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                             lVar17 * 8 + 4);
                local_2f68._0_4_ =
                     iVar8 - *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.
                                              ptr + lVar17 * 8);
                pQVar39 = (QPoint *)local_2f60;
                pQVar34 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)
                          local_2f68;
                qVar58 = 0x7f80;
                goto LAB_00413740;
              }
              while( true ) {
                iVar7 = (int)uVar23;
                uVar10 = (int)uVar24 * -0x1090 + iVar7 * 0x3dd2 >> 0xe;
                uVar23 = (ulong)uVar10;
                uVar25 = iVar7 * 0x1090 + (int)uVar24 * 0x3dd2 >> 0xe;
                uVar24 = (ulong)uVar25;
                pcVar21 = (char *)local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                          lVar17 * 8;
                if ((int)(uVar10 * *(int *)((char *)local_24b8.super_QVLABase<QPoint>.
                                                    super_QVLABaseBase.ptr + lVar17 * 8 + 4)) <=
                    (int)(uVar25 * *(int *)((char *)local_24b8.super_QVLABase<QPoint>.
                                                    super_QVLABaseBase.ptr + lVar17 * 8))) break;
                local_2f68._4_4_ = *(int *)(pcVar21 + 4) - uVar25;
                local_2f68._0_4_ = *(int *)pcVar21 - uVar10;
                drawTriangle<((anonymous_namespace)::FillClip)0>
                          (bits,width,(int)pcVar21,(QPoint *)local_2f60,(QPoint *)local_2f68,
                           (QPoint *)0x7f80,iVar60);
                local_2f60._0_4_ = local_2f68._0_4_;
                local_2f60._4_4_ = local_2f68._4_4_;
              }
              local_2f68._4_4_ =
                   *(int *)(pcVar21 + 4) -
                   *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                           lVar17 * 8 + 4);
              local_2f68._0_4_ =
                   *(int *)pcVar21 -
                   *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                           lVar17 * 8);
              pQVar18 = (QPoint *)local_2f60;
              pQVar34 = (QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> *)local_2f68;
              pQVar39 = (QPoint *)0x7f80;
LAB_0041377a:
              uVar59 = 0x41377f;
              drawTriangle<((anonymous_namespace)::FillClip)0>
                        (bits,width,(int)pcVar21,pQVar18,(QPoint *)pQVar34,pQVar39,iVar60);
            }
            else {
              if (((char *)local_2f00.super_QVLABase<bool>.super_QVLABaseBase.ptr)[lVar17] == '\0')
              {
                while( true ) {
                  iVar7 = (int)uVar23;
                  uVar10 = (int)uVar24 * 0x1090 + iVar7 * 0x3dd2 >> 0xe;
                  uVar23 = (ulong)uVar10;
                  local_2f68._4_4_ = iVar7 * -0x1090 + (int)uVar24 * 0x3dd2 >> 0xe;
                  uVar24 = (ulong)(uint)local_2f68._4_4_;
                  pcVar21 = (char *)local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                            lVar17 * 8;
                  if (local_2f68._4_4_ *
                      *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                              lVar17 * 8) <=
                      (int)(uVar10 * *(int *)((char *)local_24b8.super_QVLABase<QPoint>.
                                                      super_QVLABaseBase.ptr + lVar17 * 8 + 4)))
                  break;
                  local_2f68._0_4_ = *(int *)pcVar21 + uVar10;
                  local_2f68._4_4_ = *(int *)(pcVar21 + 4) + local_2f68._4_4_;
                  drawTriangle<((anonymous_namespace)::FillClip)0>
                            (bits,width,(int)pcVar21,(QPoint *)local_2f68,(QPoint *)&scans,
                             (QPoint *)0xffff8080,iVar60);
                  scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a.
                  _0_4_ = local_2f68._0_4_;
                  scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a.
                  _4_4_ = local_2f68._4_4_;
                }
                local_2f68._4_4_ =
                     *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                             lVar17 * 8 + 4) + *(int *)(pcVar21 + 4);
                local_2f68._0_4_ =
                     *(int *)pcVar21 +
                     *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                             lVar17 * 8);
                pQVar18 = (QPoint *)local_2f68;
                pQVar34 = &scans;
                pQVar39 = (QPoint *)0xffff8080;
                goto LAB_0041377a;
              }
              while( true ) {
                iVar8 = (int)uVar23;
                uVar10 = (int)uVar24 * 0x1090 + iVar8 * 0x3dd2 >> 0xe;
                uVar23 = (ulong)uVar10;
                local_2f68._4_4_ = iVar8 * -0x1090 + (int)uVar24 * 0x3dd2 >> 0xe;
                uVar24 = (ulong)(uint)local_2f68._4_4_;
                pQVar18 = (QPoint *)
                          ((char *)local_2cd0.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                          lVar17 * 8);
                local_2f68._0_4_ = (pQVar18->xp).m_i;
                if (local_2f68._4_4_ *
                    *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                            lVar17 * 8) <=
                    (int)(uVar10 * *(int *)((char *)local_24b8.super_QVLABase<QPoint>.
                                                    super_QVLABaseBase.ptr + lVar17 * 8 + 4)))
                break;
                local_2f68._0_4_ = local_2f68._0_4_ + uVar10;
                local_2f68._4_4_ = (pQVar18->yp).m_i + local_2f68._4_4_;
                drawTriangle<((anonymous_namespace)::FillClip)1>
                          (bits,width,iVar7,pQVar18,(QPoint *)local_2f68,(QPoint *)&scans,-0x7f80);
                scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a.
                _0_4_ = local_2f68._0_4_;
                scans.super_QVLABase<QVarLengthArray<unsigned_short,_16LL>_>.super_QVLABaseBase.a.
                _4_4_ = local_2f68._4_4_;
              }
              local_2f68._4_4_ =
                   *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                           lVar17 * 8 + 4) + (pQVar18->yp).m_i;
              local_2f68._0_4_ =
                   local_2f68._0_4_ +
                   *(int *)((char *)local_24b8.super_QVLABase<QPoint>.super_QVLABaseBase.ptr +
                           lVar17 * 8);
              pQVar39 = (QPoint *)local_2f68;
              pQVar34 = &scans;
              qVar58 = -0x7f80;
LAB_00413740:
              drawTriangle<((anonymous_namespace)::FillClip)1>
                        (bits,width,iVar7,pQVar18,pQVar39,(QPoint *)pQVar34,qVar58);
            }
            iVar7 = (int)local_2fa8;
            puVar48 = local_2fc8;
            lVar47 = local_2fa8 + 1;
          }
        }
        iVar7 = 0;
        piVar28 = bits;
        if ((int)width < 1) {
          width = 0;
        }
        for (; uVar10 = width, iVar7 != (int)local_2f90; iVar7 = iVar7 + 1) {
          while (bVar6 = uVar10 != 0, uVar10 = uVar10 - 1, bVar6) {
            *local_2fb8 = (uchar)((uint)(0x7f80 - *piVar28) >> 8);
            piVar28 = piVar28 + 1;
            local_2fb8 = local_2fb8 + 1;
          }
        }
        QVarLengthArray<bool,_256LL>::~QVarLengthArray(&local_2f00);
        QVarLengthArray<bool,_256LL>::~QVarLengthArray(&local_2de8);
        QVarLengthArray<QPoint,_256LL>::~QVarLengthArray(&local_2cd0);
        QVarLengthArray<QPoint,_256LL>::~QVarLengthArray(&local_24b8);
        operator_delete__(bits);
        pQVar12 = local_2f98;
      }
      QDataBuffer<QPoint>::~QDataBuffer(&local_2f58);
      QDataBuffer<unsigned_int>::~QDataBuffer(&local_2f38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return pQVar12;
  }
  __stack_chk_fail();
}

Assistant:

QDistanceFieldData *QDistanceFieldData::create(QSize size, const QPainterPath &path, bool doubleResolution)
{
    QDistanceFieldData *data = create(size);
    makeDistanceField(data,
                      path,
                      QT_DISTANCEFIELD_SCALE(doubleResolution),
                      QT_DISTANCEFIELD_RADIUS(doubleResolution) / QT_DISTANCEFIELD_SCALE(doubleResolution));
    return data;
}